

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree_handler.c
# Opt level: O0

ion_err_t bpptree_delete_dictionary(ion_dictionary_t *dictionary)

{
  int iVar1;
  int iVar2;
  int actual_value_filename_length;
  int actual_addr_filename_length;
  char value_filename [12];
  char addr_filename [12];
  ion_err_t error;
  ion_dictionary_t *dictionary_local;
  
  iVar1 = dictionary_get_filename(dictionary->instance->id,"bpt",value_filename + 4);
  iVar2 = dictionary_get_filename
                    (dictionary->instance->id,"val",
                     (char *)((long)&actual_value_filename_length + 3));
  if ((iVar1 < 0xc) && (iVar2 < 0xc)) {
    dictionary_local._7_1_ = bpptree_close_dictionary(dictionary);
    if (dictionary_local._7_1_ == '\0') {
      ion_fremove(value_filename + 4);
      ion_fremove((char *)((long)&actual_value_filename_length + 3));
      dictionary_local._7_1_ = '\0';
    }
  }
  else {
    dictionary_local._7_1_ = '\x04';
  }
  return dictionary_local._7_1_;
}

Assistant:

ion_err_t
bpptree_delete_dictionary(
	ion_dictionary_t *dictionary
) {
	ion_err_t error;

	char	addr_filename[ION_MAX_FILENAME_LENGTH];
	char	value_filename[ION_MAX_FILENAME_LENGTH];

	int actual_addr_filename_length		= dictionary_get_filename(dictionary->instance->id, "bpt", addr_filename);
	int actual_value_filename_length	= dictionary_get_filename(dictionary->instance->id, "val", value_filename);

	if ((actual_addr_filename_length >= ION_MAX_FILENAME_LENGTH) || (actual_value_filename_length >= ION_MAX_FILENAME_LENGTH)) {
		return err_dictionary_destruction_error;
	}

	error = bpptree_close_dictionary(dictionary);

	if (err_ok != error) {
		return error;
	}

	ion_fremove(addr_filename);
	ion_fremove(value_filename);

	return err_ok;
}